

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O3

int bfgs_min2(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
             double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
             double xtol,double *xf)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar12;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar13;
  double dVar14;
  double local_100;
  double alpha;
  double local_f0;
  double *local_e8;
  custom_gradient *local_e0;
  undefined1 local_d8 [16];
  double local_c0;
  double fxf;
  double local_b0;
  custom_function *local_a8;
  double local_a0;
  double local_98;
  double *local_90;
  undefined1 local_88 [16];
  double *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  int local_34;
  
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = fsval;
  local_88._12_4_ = in_XMM0_Dd;
  sVar6 = (long)N * 8;
  alpha = xtol;
  local_f0 = ftol;
  local_e0 = funcgrad;
  local_b0 = eps;
  local_a8 = funcpt;
  local_98 = gtol;
  local_58 = maxstep;
  local_50 = xi;
  local_70 = (double *)malloc(sVar6);
  local_90 = (double *)malloc(sVar6);
  local_48 = (double *)malloc(sVar6);
  fxf = (double)malloc(sVar6);
  local_40 = (double *)malloc((long)N * sVar6);
  local_e8 = (double *)malloc(sVar6);
  *niter = 0;
  if (local_b0 < 0.0) {
    local_a0 = sqrt(local_b0);
  }
  else {
    local_a0 = SQRT(local_b0);
  }
  pdVar9 = local_48;
  pdVar7 = local_70;
  local_100 = 1.0;
  if (0 < N) {
    uVar4 = 0;
    do {
      local_50[uVar4] = dx[uVar4] * local_50[uVar4];
      dx[uVar4] = 1.0 / dx[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  local_68 = (*local_a8->funcpt)(local_50,N,local_a8->params);
  uVar4 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
  local_34 = 0;
  local_d8._8_4_ = (int)uVar4;
  local_d8._0_8_ = ABS(local_68);
  local_d8._12_4_ = (int)(uVar4 >> 0x20);
  uStack_60 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  if (1.79769313486232e+308 <= ABS(local_68)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(local_68)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  pdVar5 = local_50;
  iVar3 = grad_fd(local_a8,local_e0,local_50,N,dx,local_a0,pdVar7);
  if (iVar3 == 0xf) {
    local_34 = 0xf;
  }
  if (local_58 <= 0.0) {
    dVar2 = 0.0;
    local_58 = 0.0;
    if (0 < N) {
      uVar4 = 0;
      dVar2 = 0.0;
      do {
        dVar14 = dx[uVar4];
        dVar1 = pdVar5[uVar4];
        dVar2 = dVar2 + dVar14 * dVar14;
        local_58 = local_58 + dVar14 * dVar1 * dVar14 * dVar1;
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    if (local_58 < 0.0) {
      dVar14 = local_58;
      local_58 = dVar2;
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(local_58);
      local_58 = dVar2;
    }
    pdVar5 = local_50;
    if (local_58 <= dVar14) {
      local_58 = dVar14 * 1000.0;
    }
    else {
      local_58 = local_58 * 1000.0;
    }
  }
  if (N < 1) {
    dVar2 = array_max_abs(local_90,N);
    iVar3 = local_34;
    if (dVar2 <= local_98 * 0.001) {
      iVar3 = 1;
    }
LAB_0012ed4b:
    uVar10 = local_d8._0_4_;
    uVar11 = local_d8._4_4_;
    if ((double)CONCAT44(local_d8._4_4_,local_d8._0_4_) <= (double)local_88._0_8_) {
      uVar10 = local_88._0_4_;
      uVar11 = local_88._4_4_;
    }
    if ((double)CONCAT44(uVar11,uVar10) < 0.0) {
      sqrt((double)CONCAT44(uVar11,uVar10));
    }
    pdVar5 = local_40;
  }
  else {
    dVar2 = local_d8._0_8_;
    if (local_d8._0_8_ <= ABS((double)local_88._0_8_)) {
      dVar2 = ABS((double)local_88._0_8_);
    }
    uVar8 = (ulong)(uint)N;
    uVar4 = 0;
    do {
      dVar14 = ABS(pdVar5[uVar4]);
      if (ABS(pdVar5[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
        dVar14 = 1.0 / ABS(dx[uVar4]);
      }
      local_90[uVar4] = (ABS(pdVar7[uVar4]) * dVar14) / dVar2;
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
    dVar2 = array_max_abs(local_90,N);
    uVar10 = local_d8._0_4_;
    uVar11 = local_d8._4_4_;
    iVar3 = local_34;
    if (dVar2 <= local_98 * 0.001) {
      if (N < 1) {
        pdVar9 = local_48;
        local_d8._0_4_ = uVar10;
        local_d8._4_4_ = uVar11;
        iVar3 = 1;
        goto LAB_0012ed4b;
      }
      uVar4 = 0;
      do {
        xf[uVar4] = local_50[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar8 != uVar4);
      iVar3 = 1;
    }
    if (local_d8._0_8_ <= (double)local_88._0_8_) {
      uVar10 = local_88._0_4_;
      uVar11 = local_88._4_4_;
    }
    if ((double)CONCAT44(uVar11,uVar10) < 0.0) {
      dVar2 = sqrt((double)CONCAT44(uVar11,uVar10));
    }
    else {
      dVar2 = SQRT((double)CONCAT44(uVar11,uVar10));
    }
    local_88._0_8_ = dVar2;
    pdVar5 = local_40;
    pdVar9 = local_48;
    if (0 < N) {
      local_d8._0_8_ = uVar8 * 8;
      uVar4 = 0;
      sVar6 = 0;
      local_34 = iVar3;
      do {
        *(double *)((long)pdVar5 + (uVar4 & 0xffffffff) * 8 + sVar6) =
             *(double *)((long)dx + sVar6) * (double)local_88._0_8_;
        if (sVar6 != 0) {
          memset(local_40 + uVar4,0,sVar6);
          pdVar5 = local_40;
        }
        pdVar9 = local_48;
        pdVar7 = local_70;
        sVar6 = sVar6 + 8;
        uVar4 = uVar4 + uVar8;
      } while (local_d8._0_8_ != sVar6);
      if (0 < N) {
        memcpy(local_48,local_50,uVar8 << 3);
        pdVar5 = local_40;
      }
      iVar3 = local_34;
    }
  }
  local_c0 = (double)CONCAT44(local_68._4_4_,(undefined4)local_68);
  if (iVar3 == 0) {
    local_88._0_8_ = (ulong)(uint)N << 3;
    uVar10 = (undefined4)local_68;
    uVar11 = local_68._4_4_;
    uVar12 = (undefined4)uStack_60;
    uVar13 = uStack_60._4_4_;
    do {
      pdVar7 = local_70;
      if (MAXITER <= *niter) {
        pdVar9 = local_48;
        iVar3 = 4;
        break;
      }
      local_68 = (double)CONCAT44(uVar11,uVar10);
      uStack_60 = CONCAT44(uVar13,uVar12);
      *niter = *niter + 1;
      scale(local_70,1,N,-1.0);
      linsolve_lower(pdVar5,N,pdVar7,(double *)fxf);
      scale(pdVar7,1,N,-1.0);
      pdVar9 = local_e8;
      if (0 < N) {
        memcpy(local_e8,pdVar7,local_88._0_8_);
      }
      pdVar5 = local_48;
      iVar3 = lnsrchmt(local_a8,local_e0,local_48,&local_c0,pdVar7,&local_100,(double *)fxf,N,dx,
                       local_58,MAXITER,local_a0,local_f0,local_98,alpha,xf);
      local_34 = stopcheck2_mt(local_c0,N,local_68,pdVar7,dx,local_b0,local_98,local_f0,iVar3);
      local_68 = local_c0;
      uStack_60 = 0;
      bfgs_factored(local_40,N,local_b0,pdVar5,xf,pdVar9,pdVar7);
      if (0 < N) {
        memcpy(pdVar5,xf,local_88._0_8_);
      }
      pdVar5 = local_40;
      pdVar7 = local_70;
      pdVar9 = local_48;
      uVar10 = (undefined4)local_68;
      uVar11 = local_68._4_4_;
      uVar12 = (undefined4)uStack_60;
      uVar13 = uStack_60._4_4_;
      iVar3 = local_34;
    } while (local_34 == 0);
  }
  if (0 < N) {
    uVar4 = 0;
    do {
      local_50[uVar4] = dx[uVar4] * local_50[uVar4];
      dx[uVar4] = 1.0 / dx[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  free(pdVar7);
  free(local_90);
  free(pdVar9);
  free(local_40);
  free((void *)fxf);
  free(local_e8);
  return iVar3;
}

Assistant:

int bfgs_min2(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval, double maxstep, int MAXITER, int *niter,
	double eps, double gtol, double ftol, double xtol, double *xf)  {
	int rcode, gfdcode;
	int i, siter, retval;
	double dt1, dt2;
	double fx, num, den, stop0, fxf, eps2,fo,alpha;
	double *jac, *hess, *scheck, *xc, *L, *step, *jacf;

	jac = (double*)malloc(sizeof(double)*N);
	scheck = (double*)malloc(sizeof(double)*N);
	xc = (double*)malloc(sizeof(double)*N);
	step = (double*)malloc(sizeof(double)*N);
	hess = (double*)malloc(sizeof(double)*N * N);
	L = (double*)malloc(sizeof(double)*N * N);
	jacf = (double*)malloc(sizeof(double)*N);

	/*
	* Return Codes
	*
	* Codes 1,2,3 denote possible success.
	* Codes 0 and 4 denote failure.
	*
	* 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	* 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	* 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	* 4 - Iteration Limit exceeded. Convergence not achieved.
	* 15 -Failure as Inf/Nan Values encountered
	*
	*/

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;

	//set values
	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	fo = fx;

	gfdcode = grad_fd(funcpt, funcgrad, xi, N, dx, eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
		den = fabs(fx);
	}
	else {
		den = fabs(fsval);
	}
	for (i = 0; i < N; ++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		}
		else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck, N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for (i = 0; i < N; ++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L, N, fx, fsval, dx);

	for (i = 0; i < N; ++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac, 1, N, -1.0);

		linsolve_lower(L, N, jac, step);

		scale(jac, 1, N, -1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//retval = lnsrch(funcpt, xc, jac, step, N, dx, maxstep, stol, xf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);

		//rcode = stopcheck(fxf, N, xc, xf, jacf, dx, fsval, gtol, stol, retval);
		rcode = stopcheck2_mt(fxf, N, fo, jac, dx, eps, gtol, ftol, retval);
		fo = fxf;
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L, N, eps, xc, xf, jacf, jac);
		for (i = 0; i < N; ++i) {
			xc[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}

	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}